

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::init
          (ImageBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  GLenum GVar2;
  pointer puVar3;
  code *pcVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar7;
  int texNdx;
  int iVar8;
  long lVar9;
  Vec4 *color;
  allocator_type local_a1;
  uint local_a0;
  int local_9c;
  long local_98;
  PixelBufferAccess local_90;
  TextureLevel level;
  Random rnd;
  undefined4 extraout_var_00;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  iVar5 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  dVar6 = deStringHash((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0xff23a4);
  local_90.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((ulong)local_90.super_ConstPixelBufferAccess.m_format.type << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&level,
             (long)(this->super_LayoutBindingRenderCase).m_numBindings,
             (value_type_conflict2 *)&local_90,&local_a1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&this->m_textures,&level)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&level);
  for (iVar8 = 0;
      iVar8 < (int)((ulong)((long)(this->m_textures).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_textures).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); iVar8 = iVar8 + 1)
  {
    getRandomColor((anon_unknown_1 *)&level,(Random *)&rnd.m_rnd);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &this->m_textureColors,(Vector<float,_4> *)&level);
  }
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x6f8))
            ((this->super_LayoutBindingRenderCase).m_numBindings);
  local_98 = 0;
  lVar9 = 0;
  do {
    puVar3 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_textures).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar3) >> 2) <= lVar9) {
      return (int)puVar3;
    }
    local_9c = (this->super_LayoutBindingRenderCase).m_bindings.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar9];
    uVar1 = puVar3[lVar9];
    color = (Vec4 *)((long)((this->m_textureColors).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + local_98);
    iVar5 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var_00,iVar5);
    (**(code **)(lVar7 + 8))((int)lVar9 + 0x84c0);
    local_a0 = uVar1;
    (**(code **)(lVar7 + 0xb8))(this->m_textureType,uVar1);
    (**(code **)(lVar7 + 0x1360))(this->m_textureType,0x2801,0x2601);
    if (this->m_textureType == 0x806f) {
      local_90.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_90.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&level,(TextureFormat *)&local_90,1,1,1);
      tcu::TextureLevel::getAccess(&local_90,&level);
      tcu::clear(&local_90,color);
      (**(code **)(lVar7 + 0x1398))(this->m_textureType,1,0x8058,1,1,1);
      pcVar4 = *(code **)(lVar7 + 0x13c0);
      GVar2 = this->m_textureType;
      tcu::TextureLevel::getAccess(&local_90,&level);
      (*pcVar4)(GVar2,0,0,0,0,1,1,1,0x1908,0x1401,local_90.super_ConstPixelBufferAccess.m_data);
LAB_00440b83:
      tcu::TextureLevel::~TextureLevel(&level);
    }
    else if (this->m_textureType == 0xde1) {
      local_90.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_90.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&level,(TextureFormat *)&local_90,1,1,1);
      tcu::TextureLevel::getAccess(&local_90,&level);
      tcu::clear(&local_90,color);
      (**(code **)(lVar7 + 0x1380))(this->m_textureType,1,0x8058,1,1);
      pcVar4 = *(code **)(lVar7 + 0x13b8);
      GVar2 = this->m_textureType;
      tcu::TextureLevel::getAccess(&local_90,&level);
      (*pcVar4)(GVar2,0,0,0,1,1,0x1908,0x1401,local_90.super_ConstPixelBufferAccess.m_data);
      goto LAB_00440b83;
    }
    (**(code **)(lVar7 + 0xb8))(this->m_textureType,0);
    (**(code **)(lVar7 + 0x80))(local_9c,local_a0,0,1,0,35000,0x8058);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"Image initialization failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x5c2);
    lVar9 = lVar9 + 1;
    local_98 = local_98 + 0x10;
  } while( true );
}

Assistant:

void ImageBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();

	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);

	// Initialize image / texture resources
	m_textures = std::vector<glw::GLuint>(m_numBindings,  0);

	// Texture colors
	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		m_textureColors.push_back(getRandomColor(rnd));

	// Image textures
	gl.genTextures(m_numBindings, &m_textures[0]);

	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		initializeImage(m_bindings[texNdx], texNdx, m_textures[texNdx], m_textureColors[texNdx]);
}